

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64.c
# Opt level: O0

bool_t b64IsValid(char *b64)

{
  bool_t bVar1;
  size_t sVar2;
  byte *in_RDI;
  size_t len;
  ulong local_18;
  bool_t local_4;
  
  bVar1 = strIsValid((char *)in_RDI);
  if (bVar1 == 0) {
    local_4 = 0;
  }
  else {
    sVar2 = strLen((char *)0x121d2f);
    if ((sVar2 & 3) == 0) {
      local_18 = sVar2;
      if (((sVar2 != 0) && (in_RDI[sVar2 - 1] == 0x3d)) &&
         (local_18 = sVar2 - 1, in_RDI[sVar2 - 2] == 0x3d)) {
        local_18 = sVar2 - 2;
      }
      if ((local_18 & 3) == 3) {
        if ((b64_dec_table[in_RDI[local_18 - 1]] & 3) != 0) {
          return 0;
        }
        local_18 = local_18 - 1;
      }
      else if ((local_18 & 3) == 2) {
        if ((b64_dec_table[in_RDI[local_18 - 1]] & 0xf) != 0) {
          return 0;
        }
        local_18 = local_18 - 1;
      }
      while (local_18 != 0) {
        if (b64_dec_table[*in_RDI] == 0xff) {
          return 0;
        }
        in_RDI = in_RDI + 1;
        local_18 = local_18 - 1;
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

bool_t b64IsValid(const char* b64)
{
	size_t len;
	if (!strIsValid(b64))
		return FALSE;
	// проверить длину
	len = strLen(b64);
	if (len % 4)
		return FALSE;
	// обработать паддинг 
	if (len && b64[len - 1] == '=' && b64[--len - 1] == '=')
		--len;
	// последний блок данных из 2 октетов?
	if (len % 4 == 3)
	{
		if (b64_dec_table[(octet)b64[len - 1]] & 3)
			return FALSE;
		--len;
	}
	// последний блок данных из 1 октета?
	else if (len % 4 == 2)
	{
		if (b64_dec_table[(octet)b64[len - 1]] & 15)
			return FALSE;
		--len;
	}
	// проверить остальные символы 
	for (; len--; ++b64)
		if (b64_dec_table[(octet)*b64] == 0xFF)
			return FALSE;
	return TRUE;
}